

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFunc.cpp
# Opt level: O2

double __thiscall commandClass::log(commandClass *this,double __x)

{
  ostream *poVar1;
  int Case;
  int iVar2;
  char *pcVar3;
  int i;
  int iVar4;
  double dVar5;
  char authority_;
  char status_;
  int n;
  double local_2a8;
  double local_2a0;
  double expend_;
  double income_;
  longlong time_;
  string userID_;
  string content_;
  fstream file;
  
  std::fstream::fstream(&file);
  std::fstream::open((char *)&file,0x10c0b5);
  content_._M_dataplus._M_p = (pointer)&content_.field_2;
  content_._M_string_length = 0;
  content_.field_2._M_local_buf[0] = '\0';
  userID_._M_dataplus._M_p = (pointer)&userID_.field_2;
  userID_._M_string_length = 0;
  userID_.field_2._M_local_buf[0] = '\0';
  std::istream::seekg(&file,0x18,0);
  std::istream::read((char *)&file,(long)&n);
  puts("Reporting Employee-------------------------------------");
  iVar2 = 0;
  local_2a0 = 0.0;
  local_2a8 = 0.0;
  for (iVar4 = 1; iVar4 <= n; iVar4 = iVar4 + 1) {
    read_string(&file,&content_,0xfa);
    read_string(&file,&userID_,0x1f);
    std::istream::read((char *)&file,(long)&status_);
    std::istream::read((char *)&file,(long)&authority_);
    std::istream::read((char *)&file,(long)&time_);
    std::istream::read((char *)&file,(long)&income_);
    std::istream::read((char *)&file,(long)&expend_);
    if ('0' < authority_) {
      poVar1 = std::operator<<((ostream *)&std::cout,"COMMAND #");
      iVar2 = iVar2 + 1;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      poVar1 = std::operator<<(poVar1,":");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&userID_);
      poVar1 = std::operator<<(poVar1," required to ");
      poVar1 = std::operator<<(poVar1,(string *)&content_);
      poVar1 = std::operator<<(poVar1," at time: ");
      poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"This line of command was ");
      pcVar3 = "approved and successfully operated!";
      if (status_ == '0') {
        pcVar3 = "rejected and ignored...";
      }
      poVar1 = std::operator<<(poVar1,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
      if (local_2a0 < income_) {
        printf("After this operation, the BookStore earned %.2lf !\n",income_ - local_2a0);
      }
      if (local_2a8 < expend_) {
        printf("This operation cost the BookStore %.2lf ...\n",expend_ - local_2a8);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    local_2a0 = income_;
    local_2a8 = expend_;
  }
  puts("Employee Report ends-----------------------------------");
  std::fstream::close();
  std::__cxx11::string::~string((string *)&userID_);
  std::__cxx11::string::~string((string *)&content_);
  dVar5 = (double)std::fstream::~fstream(&file);
  return dVar5;
}

Assistant:

void commandClass::log() const {
	fstream file;
	file.open("Data_Basic.dat", ios::in | ios::out | ios::binary);
	string content_, userID_; char status_, authority_; long long time_; int n;
	double income_last = 0, expend_last = 0, income_, expend_;
	file.seekg(24);
	file.read(reinterpret_cast<char *> (&n), 4);
	puts("Reporting Employee-------------------------------------");
	for (int i = 1, Case = 0; i <= n; ++i){
		read_string(file, content_, 250);
		read_string(file, userID_, 31);
		file.read(&status_, 1);
		file.read(&authority_, 1);
		file.read(reinterpret_cast<char *> (&time_), 8);
		file.read(reinterpret_cast<char *> (&income_), 8);
		file.read(reinterpret_cast<char *> (&expend_), 8);
		if (authority_ >= '1') {
			cout << "COMMAND #" << ++Case << ":" << endl;
			cout << userID_ << " required to " << content_ << " at time: " << time_ << endl;
			cout << "This line of command was "
				 << (status_ == '0' ? "rejected and ignored..." : "approved and successfully operated!") << endl;
			if (income_ > income_last) {
				printf("After this operation, the BookStore earned %.2lf !\n", income_ - income_last);
			}
			if (expend_ > expend_last) {
				printf("This operation cost the BookStore %.2lf ...\n", expend_ - expend_last);
			}
			cout << endl;
		}
		income_last = income_, expend_last = expend_;
	}
	puts("Employee Report ends-----------------------------------");
	file.close();
}